

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::QCborValue(QCborValue *this,QCborTag tag,QCborValue *tv)

{
  Type TVar1;
  QCborValue *v;
  QCborTag in_RDX;
  QCborContainerPrivate *in_RSI;
  QCborContainerPrivate *in_RDI;
  QCborContainerPrivate *in_stack_000001f8;
  
  *(undefined8 *)in_RDI = 0xffffffffffffffff;
  v = (QCborValue *)operator_new(0x40);
  QCborContainerPrivate::QCborContainerPrivate(in_RDI);
  in_RDI->usedData = (size_type)v;
  *(undefined4 *)&(in_RDI->data).d.d = 0xc0;
  QBasicAtomicInteger<int>::storeRelaxed((QBasicAtomicInteger<int> *)in_RDI,(int)((ulong)v >> 0x20))
  ;
  QCborContainerPrivate::append(in_RSI,in_RDX);
  QCborContainerPrivate::append(in_RDI,v);
  TVar1 = convertToExtendedType(in_stack_000001f8);
  *(Type *)&(in_RDI->data).d.d = TVar1;
  return;
}

Assistant:

QCborValue::QCborValue(QCborTag tag, const QCborValue &tv)
    : n(-1), container(new QCborContainerPrivate), t(Tag)
{
    container->ref.storeRelaxed(1);
    container->append(tag);
    container->append(tv);
    t = convertToExtendedType(container);
}